

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPardisoSolver.cpp
# Opt level: O3

void __thiscall
TPZPardisoSolver<std::complex<long_double>_>::~TPZPardisoSolver
          (TPZPardisoSolver<std::complex<long_double>_> *this,void **vtt)

{
  longlong *plVar1;
  
  (this->super_TPZMatrixSolver<std::complex<long_double>_>).super_TPZSolver.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  (this->fPermutation)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01820b10;
  plVar1 = (this->fPermutation).fStore;
  if (plVar1 != (longlong *)0x0) {
    operator_delete__(plVar1);
  }
  TPZManVector<long_long,_64>::~TPZManVector(&this->fParam);
  TPZAutoPointer<TPZManVector<long_long,_64>_>::~TPZAutoPointer(&this->fPardisoControl);
  TPZMatrixSolver<std::complex<long_double>_>::~TPZMatrixSolver
            (&this->super_TPZMatrixSolver<std::complex<long_double>_>,vtt + 1);
  return;
}

Assistant:

TPZPardisoSolver<TVar>::~TPZPardisoSolver()
{
#ifdef USING_MKL
    long long phase = -1;
    long long n=1;
    long long av,bv,xv;
    void *a= &av,*b = &bv, *x = &xv;
    long long ia,ja,perm,nrhs = 1;
    long long Error = 0;
    if(fPardisoInitialized)
        pardiso_64 (fHandle,  &fMax_num_factors, &fMatrix_num, &fMatrixType,
                    &phase, &n, a, &ia, &ja, &perm,
                    &nrhs, &fParam[0], &fMessageLevel, b, x, &Error);
    
    if (Error) {
        DebugStop();
    }
#endif
    //we should NOT delete fSymmetricSystem and fNonSymmetricSystem
}